

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

void __thiscall
mpt::reference<mpt::layout::line>::reference
          (reference<mpt::layout::line> *this,reference<mpt::layout::line> *ref)

{
  int iVar1;
  undefined4 extraout_var;
  line *plVar2;
  
  this->_ref = (line *)0x0;
  plVar2 = ref->_ref;
  if (plVar2 != (line *)0x0) {
    iVar1 = (*(plVar2->super_metatype).super_convertable._vptr_convertable[2])(plVar2);
    if (CONCAT44(extraout_var,iVar1) == 0) {
      plVar2 = (line *)0x0;
    }
    if (this->_ref != (line *)0x0) {
      (*(this->_ref->super_metatype).super_convertable._vptr_convertable[1])();
    }
    this->_ref = plVar2;
  }
  return;
}

Assistant:

inline reference(const reference &ref) : _ref(0)
	{
		*this = ref;
	}